

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

BinaryBlockEventExpressionSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::BinaryBlockEventExpressionSyntax,slang::syntax::BinaryBlockEventExpressionSyntax_const&>
          (BumpAllocator *this,BinaryBlockEventExpressionSyntax *args)

{
  SyntaxNode *pSVar1;
  SyntaxNode *pSVar2;
  BlockEventExpressionSyntax *pBVar3;
  Info *pIVar4;
  undefined1 uVar5;
  NumericTokenFlags NVar6;
  uint32_t uVar7;
  SyntaxKind SVar8;
  undefined4 uVar9;
  BinaryBlockEventExpressionSyntax *pBVar10;
  
  pBVar10 = (BinaryBlockEventExpressionSyntax *)
            ((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((BinaryBlockEventExpressionSyntax *)this->endPtr < pBVar10 + 1) {
    pBVar10 = (BinaryBlockEventExpressionSyntax *)allocateSlow(this,0x38,8);
  }
  else {
    this->head->current = (byte *)(pBVar10 + 1);
  }
  (pBVar10->right).ptr = (args->right).ptr;
  SVar8 = (args->super_BlockEventExpressionSyntax).super_SyntaxNode.kind;
  uVar9 = *(undefined4 *)&(args->super_BlockEventExpressionSyntax).super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_BlockEventExpressionSyntax).super_SyntaxNode.parent;
  pSVar2 = (args->super_BlockEventExpressionSyntax).super_SyntaxNode.previewNode;
  pBVar3 = (args->left).ptr;
  uVar5 = (args->orKeyword).field_0x2;
  NVar6.raw = (args->orKeyword).numFlags.raw;
  uVar7 = (args->orKeyword).rawLen;
  pIVar4 = (args->orKeyword).info;
  (pBVar10->orKeyword).kind = (args->orKeyword).kind;
  (pBVar10->orKeyword).field_0x2 = uVar5;
  (pBVar10->orKeyword).numFlags = (NumericTokenFlags)NVar6.raw;
  (pBVar10->orKeyword).rawLen = uVar7;
  (pBVar10->orKeyword).info = pIVar4;
  (pBVar10->super_BlockEventExpressionSyntax).super_SyntaxNode.previewNode = pSVar2;
  (pBVar10->left).ptr = pBVar3;
  (pBVar10->super_BlockEventExpressionSyntax).super_SyntaxNode.kind = SVar8;
  *(undefined4 *)&(pBVar10->super_BlockEventExpressionSyntax).super_SyntaxNode.field_0x4 = uVar9;
  (pBVar10->super_BlockEventExpressionSyntax).super_SyntaxNode.parent = pSVar1;
  return pBVar10;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }